

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O0

bool CheckFunctionForInlining(VmFunction *function)

{
  bool bVar1;
  VmValue **ppVVar2;
  VmFunction *pVVar3;
  VmFunction *targetFunction;
  VmInstruction *inst;
  VmBlock *curr;
  uint instructions;
  VmFunction *function_local;
  
  if (function->firstBlock == (VmBlock *)0x0) {
    function_local._7_1_ = false;
  }
  else {
    bVar1 = SmallArray<VmBlock_*,_4U>::empty(&function->restoreBlocks);
    if (bVar1) {
      curr._4_4_ = 0;
      for (inst = (VmInstruction *)function->firstBlock; inst != (VmInstruction *)0x0;
          inst = (VmInstruction *)(inst->arguments).little[2]) {
        if ((inst->arguments).little[2] != (VmValue *)0x0) {
          return false;
        }
        for (targetFunction = (VmFunction *)(inst->arguments).little[3];
            targetFunction != (VmFunction *)0x0;
            targetFunction = *(VmFunction **)&targetFunction->regVmCodeSize) {
          if ((*(int *)&targetFunction->function == 0x48) ||
             (*(int *)&targetFunction->function == 0x21)) {
            return false;
          }
          if ((*(int *)&targetFunction->function == 0x1f) &&
             (ppVVar2 = SmallArray<VmValue_*,_4U>::operator[]
                                  ((SmallArray<VmValue_*,_4U> *)&targetFunction->scope,0),
             ((*ppVVar2)->type).type != VM_TYPE_FUNCTION_REF)) {
            ppVVar2 = SmallArray<VmValue_*,_4U>::operator[]
                                ((SmallArray<VmValue_*,_4U> *)&targetFunction->scope,1);
            pVVar3 = getType<VmFunction>(*ppVVar2);
            if (function == pVVar3) {
              return false;
            }
          }
          curr._4_4_ = curr._4_4_ + 1;
          if (0x10 < curr._4_4_) {
            return false;
          }
        }
      }
      function_local._7_1_ = true;
    }
    else {
      function_local._7_1_ = false;
    }
  }
  return function_local._7_1_;
}

Assistant:

bool CheckFunctionForInlining(VmFunction *function)
{
	// Can't inline external function
	if(!function->firstBlock)
		return false;

	// Can't inline coroutines
	if(!function->restoreBlocks.empty())
		return false;

	unsigned instructions = 0;

	for(VmBlock *curr = function->firstBlock; curr; curr = curr->nextSibling)
	{
		// TODO: remove single block limit
		if(curr->nextSibling)
			return false;

		for(VmInstruction *inst = curr->firstInstruction; inst; inst = inst->nextSibling)
		{
			if(inst->cmd == VM_INST_ABORT_NO_RETURN || inst->cmd == VM_INST_YIELD)
				return false;

			if(inst->cmd == VM_INST_CALL && inst->arguments[0]->type.type != VM_TYPE_FUNCTION_REF)
			{
				VmFunction *targetFunction = getType<VmFunction>(inst->arguments[1]);

				// Can't inline recursive call
				if(function == targetFunction)
					return false;
			}

			// Simplest heuristic, inline small functions
			if(++instructions > 16)
				return false;
		}
	}

	return true;
}